

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

btBroadphaseProxy * __thiscall
btAxisSweep3Internal<unsigned_short>::createProxy
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *aabbMin,btVector3 *aabbMax,
          int shapeType,void *userPtr,short collisionFilterGroup,short collisionFilterMask,
          btDispatcher *dispatcher,void *multiSapProxy)

{
  Handle *pHVar1;
  btDbvtBroadphase *pbVar2;
  unsigned_short uVar3;
  int iVar4;
  undefined4 extraout_var;
  
  uVar3 = addHandle(this,aabbMin,aabbMax,userPtr,collisionFilterGroup,collisionFilterMask,dispatcher
                    ,multiSapProxy);
  pHVar1 = this->m_pHandles;
  pbVar2 = this->m_raycastAccelerator;
  if (pbVar2 != (btDbvtBroadphase *)0x0) {
    iVar4 = (*(pbVar2->super_btBroadphaseInterface)._vptr_btBroadphaseInterface[2])
                      (pbVar2,aabbMin,aabbMax,(ulong)(uint)shapeType,userPtr,
                       (ulong)(uint)(int)collisionFilterGroup,(ulong)(uint)(int)collisionFilterMask,
                       dispatcher,0);
    pHVar1[uVar3].m_dbvtProxy = (btBroadphaseProxy *)CONCAT44(extraout_var,iVar4);
  }
  return &pHVar1[uVar3].super_btBroadphaseProxy;
}

Assistant:

btBroadphaseProxy*	btAxisSweep3Internal<BP_FP_INT_TYPE>::createProxy(  const btVector3& aabbMin,  const btVector3& aabbMax,int shapeType,void* userPtr,short int collisionFilterGroup,short int collisionFilterMask,btDispatcher* dispatcher,void* multiSapProxy)
{
		(void)shapeType;
		BP_FP_INT_TYPE handleId = addHandle(aabbMin,aabbMax, userPtr,collisionFilterGroup,collisionFilterMask,dispatcher,multiSapProxy);
		
		Handle* handle = getHandle(handleId);
		
		if (m_raycastAccelerator)
		{
			btBroadphaseProxy* rayProxy = m_raycastAccelerator->createProxy(aabbMin,aabbMax,shapeType,userPtr,collisionFilterGroup,collisionFilterMask,dispatcher,0);
			handle->m_dbvtProxy = rayProxy;
		}
		return handle;
}